

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_shader.cpp
# Opt level: O1

void gen_sketch_shade(float *ca,float *cr,float *cl,float *cp,float *l,float *e,float *norm,float p,
                     float x,float y,float radius,float *line_dir,float *c)

{
  int i;
  long lVar1;
  float fVar2;
  vec2 dot_dir;
  vec3 cnew;
  float local_60 [4];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  undefined8 local_40;
  float local_38;
  
  local_60[2] = radius;
  local_60[3] = x;
  local_50 = y;
  local_4c = p;
  gen_lambert_shade(ca,cr,cl,norm,l,c);
  gen_phong_shade(cl,cp,l,e,norm,(int)local_4c,c);
  rgb_to_grayscale(c,c);
  if (norm[2] <= 0.1) {
    lVar1 = 0;
    do {
      c[lVar1] = c[lVar1] * 0.0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  else {
    local_48 = local_60[3];
    local_44 = local_50;
    local_60[0] = *line_dir + 0.1;
    local_60[1] = line_dir[1];
    fVar2 = 0.0;
    lVar1 = 0;
    do {
      fVar2 = fVar2 + local_60[lVar1] * local_60[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    lVar1 = 0;
    do {
      local_60[lVar1] = local_60[lVar1] * (1.0 / fVar2);
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    local_38 = c[2];
    local_40 = *(undefined8 *)c;
    fVar2 = 0.0;
    lVar1 = 0;
    do {
      fVar2 = fVar2 + local_60[lVar1] * local_60[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    lVar1 = 0;
    do {
      local_60[lVar1] = local_60[lVar1] * (1.0 / fVar2);
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    draw_line(line_dir,local_60[2],&local_48,c);
    draw_line(local_60,local_60[2],&local_48,(float *)&local_40);
    if (((float)local_40 == 0.0) && (!NAN((float)local_40))) {
      lVar1 = 0;
      do {
        c[lVar1] = c[lVar1] * 0.0;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
    }
  }
  return;
}

Assistant:

void gen_sketch_shade(const vec3 ca, const vec3 cr, const vec3 cl, const vec3 cp, vec3 l, const vec3 e, const vec3 norm, const float p,
const float x, const float y, const float radius, vec2 line_dir, vec3 c){
    gen_lambert_shade(ca, cr, cl, norm, l, c);
    gen_phong_shade(cl, cp, l, e, norm, p, c);

    //calculate a grayscale output (using luminosity method)
    rgb_to_grayscale(c, c);

    //draw silhouette
    if(norm[2]<=0.1f){
        vec3_scale(c, c, 0.0f);
        return;
    }

    //draw inner sketch with a tilted overline
    vec2 dot_dir = {x, y};
    vec2 new_line = {line_dir[0] + 0.1f, line_dir[1]};
    vec2_norm(new_line, new_line);
    vec3 cnew;
    vec3_scale(cnew, c, 1.0f);
    vec2_norm(new_line, new_line);
    draw_line(line_dir, radius, dot_dir, c);
    draw_line(new_line, radius, dot_dir, cnew);

    //composite
    if(cnew[0]==0.0f) vec3_scale(c, c, 0.0f);
}